

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.h
# Opt level: O2

void __thiscall
Js::JSONStringifier::PropertyListElement::PropertyListElement
          (PropertyListElement *this,PropertyListElement *other)

{
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
            (&this->propertyRecord,(other->propertyRecord).ptr);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
            (&this->propertyName,(other->propertyName).ptr);
  return;
}

Assistant:

PropertyListElement(const PropertyListElement& other)
            : propertyRecord(other.propertyRecord), propertyName(other.propertyName)
        {}